

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_envelope_tick(xm_channel_context_t *ch,xm_envelope_t *env,uint16_t *counter,float *outval)

{
  ushort uVar1;
  float *in_RCX;
  ushort *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar2;
  uint16_t loop_length;
  uint16_t loop_end;
  uint16_t loop_start;
  uint8_t j;
  byte local_21;
  
  if (*(byte *)(in_RSI + 0x30) < 2) {
    if ((*(char *)(in_RSI + 0x30) == '\x01') &&
       (*in_RCX = (float)*(ushort *)(in_RSI + 2) / 64.0, 1.0 < *in_RCX)) {
      *in_RCX = 1.0;
    }
  }
  else {
    if (((*(byte *)(in_RSI + 0x36) & 1) != 0) &&
       (uVar1 = *(ushort *)(in_RSI + (ulong)*(byte *)(in_RSI + 0x33) * 4), uVar1 <= *in_RDX)) {
      *in_RDX = *in_RDX - (uVar1 - *(short *)(in_RSI + (ulong)*(byte *)(in_RSI + 0x32) * 4));
    }
    local_21 = 0;
    while (((int)(uint)local_21 < (int)(*(byte *)(in_RSI + 0x30) - 2) &&
           ((*in_RDX < *(ushort *)(in_RSI + (ulong)local_21 * 4) ||
            (*(ushort *)(in_RSI + (long)(int)(local_21 + 1) * 4) < *in_RDX))))) {
      local_21 = local_21 + 1;
    }
    fVar2 = xm_envelope_lerp((xm_envelope_point_t *)(in_RSI + (long)(int)(uint)local_21 * 4),
                             (xm_envelope_point_t *)(in_RSI + (long)(int)(uint)local_21 * 4 + 4),
                             *in_RDX);
    *in_RCX = fVar2 / 64.0;
    if ((((*(byte *)(in_RDI + 0x3e) & 1) == 0) || ((*(byte *)(in_RSI + 0x35) & 1) == 0)) ||
       (*in_RDX != *(ushort *)(in_RSI + (ulong)*(byte *)(in_RSI + 0x31) * 4))) {
      *in_RDX = *in_RDX + 1;
    }
  }
  return;
}

Assistant:

static void xm_envelope_tick(xm_channel_context_t* ch,
							 xm_envelope_t* env,
							 uint16_t* counter,
							 float* outval) {
	if(env->num_points < 2) {
		/* Don't really know what to do… */
		if(env->num_points == 1) {
			/* XXX I am pulling this out of my ass */
			*outval = (float)env->points[0].value / (float)0x40;
			if(*outval > 1) {
				*outval = 1;
			}
		}

		return;
	} else {
		uint8_t j;

		if(env->loop_enabled) {
			uint16_t loop_start = env->points[env->loop_start_point].frame;
			uint16_t loop_end = env->points[env->loop_end_point].frame;
			uint16_t loop_length = loop_end - loop_start;

			if(*counter >= loop_end) {
				*counter -= loop_length;
			}
		}

		for(j = 0; j < (env->num_points - 2); ++j) {
			if(env->points[j].frame <= *counter &&
			   env->points[j+1].frame >= *counter) {
				break;
			}
		}

		*outval = xm_envelope_lerp(env->points + j, env->points + j + 1, *counter) / (float)0x40;

		/* Make sure it is safe to increment frame count */
		if(!ch->sustained || !env->sustain_enabled ||
		   *counter != env->points[env->sustain_point].frame) {
			(*counter)++;
		}
	}
}